

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  U32 *src;
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  U32 *headerBuffer;
  U32 *pUVar8;
  ulong srcSize;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  uint matchlengthMaxValue;
  uint maxSymbolValue;
  short offcodeNCount [32];
  uint local_10c;
  uint local_108;
  uint local_104;
  ulong local_100;
  ZSTD_matchState_t *local_f8;
  ZSTD_CCtx_params *local_f0;
  uint local_e8 [28];
  short local_78 [36];
  
  if (dictSize < 9 || dict == (void *)0x0) {
    return 0;
  }
  bs->rep[0] = 1;
  bs->rep[1] = 4;
  bs->rep[2] = 8;
  (bs->entropy).huf.repeatMode = HUF_repeat_none;
  (bs->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  if (dictContentType == ZSTD_dct_rawContent) {
LAB_004806a5:
    ZSTD_loadDictionaryContent(ms,params,dict,dictSize,dtlm);
    return 0;
  }
  if (*dict != -0x13cf5bc9) {
    if (dictContentType == ZSTD_dct_fullDict) {
      return 0xffffffffffffffe0;
    }
    if (dictContentType == ZSTD_dct_auto) goto LAB_004806a5;
  }
  local_108 = 0x1f;
  if ((params->fParams).noDictIDFlag == 0) {
    local_100 = (ulong)*(uint *)((long)dict + 4);
  }
  else {
    local_100 = 0;
  }
  local_e8[0] = 0xff;
  local_f8 = ms;
  local_f0 = params;
  sVar3 = HUF_readCTable((HUF_CElt *)bs,local_e8,(void *)((long)dict + 8),dictSize - 8);
  if (local_e8[0] < 0xff || 0xffffffffffffff88 < sVar3) {
    return 0xffffffffffffffe2;
  }
  pUVar8 = (U32 *)(dictSize + (long)dict);
  headerBuffer = (U32 *)((long)dict + sVar3 + 8);
  sVar3 = FSE_readNCount(local_78,&local_108,local_e8,headerBuffer,(long)pUVar8 - (long)headerBuffer
                        );
  if ((sVar3 < 0xffffffffffffff89) && (local_e8[0] < 9)) {
    sVar5 = FSE_buildCTable_wksp
                      ((bs->entropy).fse.offcodeCTable,local_78,0x1f,local_e8[0],workspace,0x1800);
    bVar13 = sVar5 < 0xffffffffffffff89;
    sVar5 = 0;
    if (bVar13) {
      sVar5 = sVar3;
    }
    headerBuffer = (U32 *)((long)headerBuffer + sVar5);
  }
  else {
    bVar13 = false;
  }
  if (!bVar13) {
    return 0xffffffffffffffe2;
  }
  local_10c = 0x34;
  sVar3 = FSE_readNCount((short *)local_e8,&local_10c,&local_104,headerBuffer,
                         (long)pUVar8 - (long)headerBuffer);
  if (local_104 < 10 && sVar3 < 0xffffffffffffff89) {
    if (local_10c < 0x34) {
      bVar13 = false;
LAB_0048083a:
      uVar12 = 0xffffffffffffffe2;
    }
    else {
      uVar12 = 0;
      lVar10 = 0;
      do {
        bVar13 = local_78[lVar10 + -0x38] != 0;
        if (local_78[lVar10 + -0x38] == 0) goto LAB_0048083a;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x35);
      bVar13 = true;
    }
    if (!bVar13) goto LAB_004808a6;
    sVar4 = FSE_buildCTable_wksp
                      ((bs->entropy).fse.matchlengthCTable,(short *)local_e8,local_10c,local_104,
                       workspace,0x1800);
    sVar5 = 0;
    bVar13 = sVar4 < 0xffffffffffffff89;
    if (bVar13) {
      sVar5 = sVar3;
    }
    uVar12 = 0xffffffffffffffe2;
    headerBuffer = (U32 *)((long)headerBuffer + sVar5);
  }
  else {
    uVar12 = 0xffffffffffffffe2;
LAB_004808a6:
    bVar13 = false;
  }
  if (!bVar13) {
    return uVar12;
  }
  local_10c = 0x23;
  sVar3 = FSE_readNCount((short *)local_e8,&local_10c,&local_104,headerBuffer,
                         (long)pUVar8 - (long)headerBuffer);
  if (local_104 < 10 && sVar3 < 0xffffffffffffff89) {
    uVar9 = 0xffffffffffffffe2;
    if (local_10c < 0x23) {
      bVar13 = false;
    }
    else {
      lVar10 = 0;
      do {
        bVar13 = local_78[lVar10 + -0x38] != 0;
        if (local_78[lVar10 + -0x38] == 0) goto LAB_00480924;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x24);
      bVar13 = true;
      uVar9 = 0;
    }
LAB_00480924:
    if (bVar13) {
      sVar5 = FSE_buildCTable_wksp
                        ((bs->entropy).fse.litlengthCTable,(short *)local_e8,local_10c,local_104,
                         workspace,0x1800);
      bVar13 = sVar5 < 0xffffffffffffff89;
      uVar9 = uVar12;
      if (!bVar13) {
        sVar3 = 0;
        uVar9 = 0xffffffffffffffe2;
      }
      headerBuffer = (U32 *)((long)headerBuffer + sVar3);
      goto LAB_0048096b;
    }
  }
  else {
    uVar9 = 0xffffffffffffffe2;
  }
  bVar13 = false;
LAB_0048096b:
  uVar12 = uVar9;
  if (bVar13) {
    src = headerBuffer + 3;
    uVar12 = 0xffffffffffffffe2;
    if (src <= pUVar8) {
      bs->rep[0] = *headerBuffer;
      bs->rep[1] = headerBuffer[1];
      srcSize = (long)pUVar8 - (long)src;
      uVar7 = (int)srcSize + 0x20000;
      uVar1 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar7 = 0x1f;
      if (srcSize >> 0x11 < 0x7fff) {
        uVar7 = uVar1;
      }
      bs->rep[2] = headerBuffer[2];
      if (local_108 < uVar7) {
        bVar13 = false;
      }
      else {
        uVar6 = 0;
        do {
          bVar13 = local_78[uVar6] != 0;
          if (local_78[uVar6] == 0) goto LAB_00480a04;
          uVar6 = uVar6 + 1;
        } while (uVar7 + 1 != uVar6);
        bVar13 = true;
        uVar12 = 0;
      }
LAB_00480a04:
      if (bVar13) {
        uVar6 = 0xffffffffffffffe2;
        uVar12 = uVar6;
        bVar13 = false;
        if (((ulong)bs->rep[0] != 0) && (bVar13 = false, bs->rep[0] <= srcSize)) {
          uVar2 = 0;
          do {
            uVar11 = uVar2;
            uVar12 = uVar9;
            if ((uVar11 == 2) || (uVar12 = uVar6, (ulong)bs->rep[uVar11 + 1] == 0)) break;
            uVar2 = uVar11 + 1;
          } while (bs->rep[uVar11 + 1] <= srcSize);
          bVar13 = 1 < uVar11;
        }
        if (bVar13) {
          (bs->entropy).huf.repeatMode = HUF_repeat_valid;
          (bs->entropy).fse.offcode_repeatMode = FSE_repeat_valid;
          (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_valid;
          (bs->entropy).fse.litlength_repeatMode = FSE_repeat_valid;
          ZSTD_loadDictionaryContent(local_f8,local_f0,src,srcSize,dtlm);
          uVar12 = local_100;
        }
      }
    }
  }
  return uVar12;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<=8)) return 0;

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);
        }
        if (dictContentType == ZSTD_dct_fullDict)
            return ERROR(dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(bs, ms, params, dict, dictSize, dtlm, workspace);
}